

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.cc
# Opt level: O1

csptr __thiscall pstack::Elf::NoteDesc::data(NoteDesc *this)

{
  long *plVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  uint *in_RSI;
  csptr cVar3;
  long *local_50 [2];
  long local_40 [2];
  
  plVar1 = *(long **)(in_RSI + 4);
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"note descriptor","");
  (**(code **)(*plVar1 + 0x48))
            (this,plVar1,(string *)local_50,(ulong)(-*in_RSI & 3) + (ulong)*in_RSI + 0xc,in_RSI[1]);
  _Var2._M_pi = extraout_RDX;
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
    _Var2._M_pi = extraout_RDX_00;
  }
  cVar3.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  cVar3.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (csptr)cVar3.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Reader::csptr
NoteDesc::data() const
{
   return io->view("note descriptor", sizeof note + roundup2(note.n_namesz, 4), note.n_descsz);
}